

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O0

void __thiscall
WavingSketch<8U,_1U,_4U>::mergebuck
          (WavingSketch<8U,_1U,_4U> *this,Bucket *src1,Bucket *src2,Bucket *dest)

{
  uint uVar1;
  undefined4 *puVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  uint32_t whichcast;
  uint32_t min_choice;
  uint32_t end;
  uint32_t i;
  uint32_t i_3;
  uint32_t i_2;
  node *p;
  node *tp1;
  int i_1;
  uint in_stack_ffffffffffffff5c;
  Data<4U> *in_stack_ffffffffffffff60;
  undefined4 *local_78;
  uint local_58;
  uint local_50;
  uint local_4c;
  undefined4 *local_48;
  
  bVar3 = false;
  while (!bVar3) {
    *(short *)(in_RCX + 0x40) = *(short *)(in_RSI + 0x40) + *(short *)(in_RDX + 0x40);
    bVar3 = true;
  }
  puVar2 = (undefined4 *)operator_new__(0x80);
  local_78 = puVar2;
  do {
    node::node((node *)0x117b52);
    local_78 = local_78 + 2;
  } while (local_78 != puVar2 + 0x20);
  local_48 = puVar2;
  for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
    Data<4U>::operator=((Data<4U> *)(local_48 + 1),(Data<4U> *)(in_RSI + (ulong)local_4c * 4));
    *local_48 = *(undefined4 *)(in_RSI + 0x20 + (ulong)local_4c * 4);
    local_48 = local_48 + 2;
    *(uint *)(in_RDI + 0xa0) =
         *(int *)(in_RDI + 0xa0) - (uint)(*(int *)(in_RSI + 0x20 + (ulong)local_4c * 4) != 0);
  }
  for (local_50 = 0; local_50 < 8; local_50 = local_50 + 1) {
    Data<4U>::operator=((Data<4U> *)(local_48 + 1),(Data<4U> *)(in_RDX + (ulong)local_50 * 4));
    *local_48 = *(undefined4 *)(in_RDX + 0x20 + (ulong)local_50 * 4);
    *(uint *)(in_RDI + 0xa0) =
         *(int *)(in_RDI + 0xa0) - (uint)(*(int *)(in_RDX + 0x20 + (ulong)local_50 * 4) != 0);
    local_48 = local_48 + 2;
  }
  std::
  sort<WavingSketch<8u,1u,4u>::node*,WavingSketch<8u,1u,4u>::mergebuck(WavingSketch<8u,1u,4u>::Bucket*,WavingSketch<8u,1u,4u>::Bucket*,WavingSketch<8u,1u,4u>::Bucket*)::_lambda(WavingSketch<8u,1u,4u>::node,WavingSketch<8u,1u,4u>::node)_1_>
            (puVar2,local_48);
  for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
    Data<4U>::operator=((Data<4U> *)(in_RCX + (ulong)local_58 * 4),
                        (Data<4U> *)(puVar2 + (ulong)local_58 * 2 + 1));
    *(undefined4 *)(in_RCX + 0x20 + (ulong)local_58 * 4) = puVar2[(ulong)local_58 * 2];
    *(uint *)(in_RDI + 0xa0) = (uint)(puVar2[(ulong)local_58 * 2] != 0) + *(int *)(in_RDI + 0xa0);
  }
  while( true ) {
    bVar3 = false;
    if (local_58 < 0x10) {
      bVar3 = (int)puVar2[(ulong)local_58 * 2] < 0;
    }
    if (!bVar3) break;
    uVar1 = Data<4U>::Hash(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    Data<4U>::Hash(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    *(short *)(in_RCX + 0x40) =
         *(short *)(in_RCX + 0x40) - (short)COUNT[uVar1 & 1] * (short)puVar2[(ulong)local_58 * 2];
    local_58 = local_58 + 1;
  }
  if (puVar2 != (undefined4 *)0x0) {
    operator_delete__(puVar2);
  }
  return;
}

Assistant:

void mergebuck(Bucket* src1, Bucket* src2, Bucket* dest) {
		for (int i = 0; i < counter_num; i++)
			dest->incast[i] = src1->incast[i] + src2->incast[i];
		node* tp1 = new node[slot_num << 1];
		node* p = tp1;
		for (uint32_t i = 0; i < slot_num; i++) {
			p->item = src1->items[i];
			p->counter = src1->counters[i];
			p++;
			cnt -= src1->counters[i] != 0;
		}
		for (uint32_t i = 0; i < slot_num; i++) {
			p->item = src2->items[i];
			p->counter = src2->counters[i];
			cnt -= src2->counters[i] != 0;
			p++;
		}
		std::sort(tp1, p, [](node x, node y)-> bool {return abs(x.counter) > abs(y.counter); });
		uint32_t i = 0;
		for (i = 0; i < slot_num; i++) {
			dest->items[i] = tp1[i].item;
			dest->counters[i] = tp1[i].counter;
			cnt += tp1[i].counter != 0;
		}
		uint32_t end = slot_num << 1;
		while (i < end && tp1[i].counter < 0)  // flag=true
		{
			uint32_t min_choice = tp1[i].item.Hash(seed_s) & 1;
			uint32_t whichcast = tp1[i].item.Hash(seed_incast) % counter_num;
			dest->incast[whichcast] -= COUNT[min_choice] * tp1[i].counter;
			i++;
		}
		delete[] tp1;
	}